

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-async-null-cb.c
# Opt level: O1

int run_test_async_null_cb(void)

{
  int iVar1;
  undefined8 uVar2;
  int64_t eval_b;
  int64_t eval_a;
  
  async_handle.queue.prev._0_4_ = 0xffffffff;
  async_handle.queue.prev._4_4_ = 0xffffffff;
  async_handle.busy = -1;
  async_handle.pending = -1;
  async_handle.async_cb._0_4_ = 0xffffffff;
  async_handle.async_cb._4_4_ = 0xffffffff;
  async_handle.queue.next._0_4_ = 0xffffffff;
  async_handle.queue.next._4_4_ = 0xffffffff;
  async_handle.next_closing._0_4_ = 0xffffffff;
  async_handle.next_closing._4_4_ = 0xffffffff;
  async_handle.flags = 0xffffffff;
  async_handle._60_4_ = 0xffffffff;
  async_handle.handle_queue.prev._0_4_ = 0xffffffff;
  async_handle.handle_queue.next = (uv__queue *)0xffffffffffffffff;
  async_handle.handle_queue.prev._4_4_ = 0xffffffff;
  async_handle.type = ~UV_UNKNOWN_HANDLE;
  async_handle._20_4_ = 0xffffffff;
  async_handle.close_cb._0_4_ = 0xffffffff;
  async_handle.close_cb._4_4_ = 0xffffffff;
  async_handle.data._0_4_ = 0xffffffff;
  async_handle.data._4_4_ = 0xffffffff;
  async_handle.loop._0_4_ = 0xffffffff;
  async_handle.loop._4_4_ = 0xffffffff;
  uVar2 = uv_default_loop();
  iVar1 = uv_async_init(uVar2,&async_handle,0);
  if (iVar1 == 0) {
    uVar2 = uv_default_loop();
    iVar1 = uv_check_init(uVar2,&check_handle);
    if (iVar1 != 0) goto LAB_00181ef8;
    iVar1 = uv_check_start(&check_handle,check_cb);
    if (iVar1 != 0) goto LAB_00181f05;
    iVar1 = uv_thread_create(&thread,thread_cb,0);
    if (iVar1 != 0) goto LAB_00181f12;
    uVar2 = uv_default_loop();
    iVar1 = uv_run(uVar2,0);
    if (iVar1 != 0) goto LAB_00181f1f;
    iVar1 = uv_thread_join(&thread);
    if (iVar1 != 0) goto LAB_00181f2c;
    if (check_cb_called == 1) {
      uVar2 = uv_default_loop();
      uv_walk(uVar2,close_walk_cb,0);
      uv_run(uVar2,0);
      uVar2 = uv_default_loop();
      iVar1 = uv_loop_close(uVar2);
      if (iVar1 == 0) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_00181f46;
    }
  }
  else {
    run_test_async_null_cb_cold_1();
LAB_00181ef8:
    run_test_async_null_cb_cold_2();
LAB_00181f05:
    run_test_async_null_cb_cold_3();
LAB_00181f12:
    run_test_async_null_cb_cold_4();
LAB_00181f1f:
    run_test_async_null_cb_cold_5();
LAB_00181f2c:
    run_test_async_null_cb_cold_6();
  }
  run_test_async_null_cb_cold_7();
LAB_00181f46:
  run_test_async_null_cb_cold_8();
  if (check_cb_called == 0) {
    uv_close(&async_handle,0);
    iVar1 = uv_close(&check_handle,0);
    check_cb_called = check_cb_called + 1;
    return iVar1;
  }
  check_cb_cold_1();
  iVar1 = uv_async_send(&async_handle);
  return iVar1;
}

Assistant:

TEST_IMPL(async_null_cb) {
  /*
   * Fill async_handle with garbage values.
   * uv_async_init() should properly initialize struct fields regardless of
   * initial values.
   * This is added to verify paddings between fields do not affect behavior.
   */
  memset(&async_handle, 0xff, sizeof(async_handle));

  ASSERT_OK(uv_async_init(uv_default_loop(), &async_handle, NULL));
  ASSERT_OK(uv_check_init(uv_default_loop(), &check_handle));
  ASSERT_OK(uv_check_start(&check_handle, check_cb));
  ASSERT_OK(uv_thread_create(&thread, thread_cb, NULL));
  ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_DEFAULT));
  ASSERT_OK(uv_thread_join(&thread));
  ASSERT_EQ(1, check_cb_called);
  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}